

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartCachedFunction<duckdb::DatePart::DayOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  ulong *puVar2;
  UnifiedVectorFormat *pUVar3;
  int64_t *piVar4;
  int64_t *piVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  byte bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar10;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar11;
  date_t dVar12;
  reference vector;
  UnifiedVectorFormat *pUVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  int64_t iVar15;
  ulong uVar16;
  long lVar17;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar18;
  VectorType VVar19;
  ulong uVar20;
  UnifiedVectorFormat *pUVar21;
  UnifiedVectorFormat *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  long local_a0;
  reference local_98;
  ulong local_90;
  long local_88;
  unsigned_long local_80;
  optional_ptr<duckdb::FunctionLocalState,_true> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_78.ptr = *(FunctionLocalState **)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_78);
  oVar10.ptr = local_78.ptr;
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pUVar3 = *(UnifiedVectorFormat **)(args + 0x18);
  VVar19 = (VectorType)result;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar19);
    lVar17 = *(long *)(result + 0x20);
    lVar6 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (*(long *)(vector + 0x28) == 0) {
      if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        pUVar18 = (UnifiedVectorFormat *)0x0;
        do {
          dVar12.days = duckdb::Timestamp::GetDate
                                  ((timestamp_t)*(int64_t *)(lVar6 + (long)pUVar18 * 8));
          iVar15 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::DayOperator> *)(oVar10.ptr + 8),
                              dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar18);
          *(int64_t *)(lVar17 + (long)pUVar18 * 8) = iVar15;
          pUVar18 = pUVar18 + 1;
        } while (pUVar3 != pUVar18);
      }
    }
    else {
      local_98 = vector + 0x28;
      *(UnifiedVectorFormat **)(result + 0x40) = pUVar3;
      local_b8 = pUVar3;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)local_98,(unsigned_long *)&local_b8);
      p_Var9 = p_Stack_70;
      oVar11.ptr = local_78.ptr;
      local_78.ptr = (FunctionLocalState *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(FunctionLocalState **)(result + 0x30) = oVar11.ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      *(unsigned_long **)pVVar1 =
           (unsigned_long *)
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if ((UnifiedVectorFormat *)0x3f < pUVar3 + 0x3f) {
        local_90 = 0;
        pUVar18 = (UnifiedVectorFormat *)0x0;
        local_a0 = lVar17;
        do {
          if (*(long *)local_98 == 0) {
            uVar20 = 0xffffffffffffffff;
          }
          else {
            uVar20 = *(ulong *)(*(long *)local_98 + local_90 * 8);
          }
          pUVar13 = pUVar18 + 0x40;
          if (pUVar3 <= pUVar18 + 0x40) {
            pUVar13 = pUVar3;
          }
          pUVar21 = pUVar13;
          if (uVar20 != 0) {
            pUVar21 = pUVar18;
            if (uVar20 == 0xffffffffffffffff) {
              if (pUVar18 < pUVar13) {
                do {
                  dVar12.days = duckdb::Timestamp::GetDate
                                          ((timestamp_t)*(int64_t *)(lVar6 + (long)pUVar21 * 8));
                  iVar15 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                                     ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                                      (oVar10.ptr + 8),dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar21)
                  ;
                  *(int64_t *)(lVar17 + (long)pUVar21 * 8) = iVar15;
                  pUVar21 = pUVar21 + 1;
                } while (pUVar13 != pUVar21);
              }
            }
            else if (pUVar18 < pUVar13) {
              local_88 = lVar17 + (long)pUVar18 * 8;
              uVar16 = 0;
              do {
                if ((uVar20 >> (uVar16 & 0x3f) & 1) != 0) {
                  dVar12.days = duckdb::Timestamp::GetDate
                                          ((timestamp_t)
                                           *(int64_t *)(lVar6 + (long)pUVar18 * 8 + uVar16 * 8));
                  iVar15 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                                     ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                                      (oVar10.ptr + 8),dVar12,(ValidityMask *)pVVar1,
                                      (idx_t)(pUVar18 + uVar16));
                  *(int64_t *)(local_88 + uVar16 * 8) = iVar15;
                }
                uVar16 = uVar16 + 1;
              } while (pUVar18 + (uVar16 - (long)pUVar13) != (UnifiedVectorFormat *)0x0);
              lVar17 = local_a0;
              pUVar21 = pUVar18 + uVar16;
            }
          }
          local_90 = local_90 + 1;
          pUVar18 = pUVar21;
        } while (local_90 != (ulong)(pUVar3 + 0x3f) >> 6);
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar19);
    piVar4 = *(int64_t **)(result + 0x20);
    piVar5 = *(int64_t **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      dVar12.days = duckdb::Timestamp::GetDate((timestamp_t)*piVar5);
      iVar15 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::DayOperator> *)(oVar10.ptr + 8),dVar12,
                          (ValidityMask *)(result + 0x28),0);
      *piVar4 = iVar15;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar3);
    duckdb::Vector::SetVectorType(VVar19);
    oVar11.ptr = local_78.ptr;
    lVar17 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = result + 0x28;
    if (local_68 == 0) {
      if (pUVar3 != (UnifiedVectorFormat *)0x0) {
        lVar6 = *(long *)oVar11.ptr;
        pUVar18 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar13 = pUVar18;
          if (lVar6 != 0) {
            pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar18 * 4);
          }
          dVar12.days = duckdb::Timestamp::GetDate
                                  ((timestamp_t)*(int64_t *)((long)p_Stack_70 + (long)pUVar13 * 8));
          iVar15 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::DayOperator> *)(oVar10.ptr + 8),
                              dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar18);
          *(int64_t *)(lVar17 + (long)pUVar18 * 8) = iVar15;
          pUVar18 = pUVar18 + 1;
        } while (pUVar3 != pUVar18);
      }
    }
    else if (pUVar3 != (UnifiedVectorFormat *)0x0) {
      lVar6 = *(long *)oVar11.ptr;
      pUVar18 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar13 = pUVar18;
        if (lVar6 != 0) {
          pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar18 * 4);
        }
        if ((*(ulong *)(local_68 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1) == 0)
        {
          if (*(long *)pVVar1 == 0) {
            local_80 = *(unsigned_long *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_b8,&local_80);
            p_Var9 = p_Stack_b0;
            pUVar13 = local_b8;
            local_b8 = (UnifiedVectorFormat *)0x0;
            p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(UnifiedVectorFormat **)(result + 0x30) = pUVar13;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            *(unsigned_long **)pVVar1 =
                 (unsigned_long *)
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar8 = (byte)pUVar18 & 0x3f;
          puVar2 = (ulong *)(*(long *)pVVar1 + ((ulong)pUVar18 >> 6) * 8);
          *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          dVar12.days = duckdb::Timestamp::GetDate
                                  ((timestamp_t)*(int64_t *)((long)p_Stack_70 + (long)pUVar13 * 8));
          iVar15 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::DayOperator> *)(oVar10.ptr + 8),
                              dVar12,(ValidityMask *)pVVar1,(idx_t)pUVar18);
          *(int64_t *)(lVar17 + (long)pUVar18 * 8) = iVar15;
        }
        pUVar18 = pUVar18 + 1;
      } while (pUVar3 != pUVar18);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}